

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiMesh **_dest,aiMesh *src)

{
  aiFace *__dest;
  aiBone ***pppaVar1;
  aiAnimMesh ***pppaVar2;
  uint uVar3;
  aiVector3D *paVar4;
  aiColor4D *__src;
  aiBone **ppaVar5;
  aiFace *paVar6;
  void *__src_00;
  aiAnimMesh **ppaVar7;
  aiMesh *__dest_00;
  aiVector3D *paVar8;
  aiColor4D *__s;
  aiBone **ppaVar9;
  ulong *puVar10;
  void *__dest_01;
  aiAnimMesh **ppaVar11;
  aiFace *paVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (src != (aiMesh *)0x0 && _dest != (aiMesh **)0x0) {
    __dest_00 = (aiMesh *)operator_new(0x520);
    __dest_00->mPrimitiveTypes = 0;
    __dest_00->mNumVertices = 0;
    __dest_00->mNumFaces = 0;
    memset(&__dest_00->mVertices,0,0xcc);
    __dest_00->mBones = (aiBone **)0x0;
    __dest_00->mMaterialIndex = 0;
    (__dest_00->mName).length = 0;
    (__dest_00->mName).data[0] = '\0';
    memset((__dest_00->mName).data + 1,0x1b,0x3ff);
    __dest_00->mNumAnimMeshes = 0;
    __dest_00->mAnimMeshes = (aiAnimMesh **)0x0;
    __dest_00->mMethod = 0;
    (__dest_00->mAABB).mMin.x = 0.0;
    (__dest_00->mAABB).mMin.y = 0.0;
    (__dest_00->mAABB).mMin.z = 0.0;
    (__dest_00->mAABB).mMax.x = 0.0;
    (__dest_00->mAABB).mMax.y = 0.0;
    (__dest_00->mAABB).mMax.z = 0.0;
    __dest_00->mTextureCoords[0] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[1] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[2] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[3] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[4] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[5] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[6] = (aiVector3D *)0x0;
    __dest_00->mTextureCoords[7] = (aiVector3D *)0x0;
    __dest_00->mNumUVComponents[0] = 0;
    __dest_00->mNumUVComponents[1] = 0;
    __dest_00->mNumUVComponents[2] = 0;
    __dest_00->mNumUVComponents[3] = 0;
    __dest_00->mNumUVComponents[4] = 0;
    __dest_00->mNumUVComponents[5] = 0;
    __dest_00->mNumUVComponents[6] = 0;
    __dest_00->mNumUVComponents[7] = 0;
    __dest_00->mColors[0] = (aiColor4D *)0x0;
    __dest_00->mColors[1] = (aiColor4D *)0x0;
    __dest_00->mColors[2] = (aiColor4D *)0x0;
    __dest_00->mColors[3] = (aiColor4D *)0x0;
    __dest_00->mColors[4] = (aiColor4D *)0x0;
    __dest_00->mColors[5] = (aiColor4D *)0x0;
    __dest_00->mColors[6] = (aiColor4D *)0x0;
    __dest_00->mColors[7] = (aiColor4D *)0x0;
    *_dest = __dest_00;
    memcpy(__dest_00,src,0x520);
    paVar4 = __dest_00->mVertices;
    if (paVar4 != (aiVector3D *)0x0) {
      uVar3 = __dest_00->mNumVertices;
      uVar15 = (ulong)uVar3 * 0xc;
      paVar8 = (aiVector3D *)operator_new__(uVar15);
      if ((ulong)uVar3 != 0) {
        memset(paVar8,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest_00->mVertices = paVar8;
      memcpy(paVar8,paVar4,uVar15);
    }
    paVar4 = __dest_00->mNormals;
    if (paVar4 != (aiVector3D *)0x0) {
      uVar3 = __dest_00->mNumVertices;
      uVar15 = (ulong)uVar3 * 0xc;
      paVar8 = (aiVector3D *)operator_new__(uVar15);
      if ((ulong)uVar3 != 0) {
        memset(paVar8,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest_00->mNormals = paVar8;
      memcpy(paVar8,paVar4,uVar15);
    }
    paVar4 = __dest_00->mTangents;
    if (paVar4 != (aiVector3D *)0x0) {
      uVar3 = __dest_00->mNumVertices;
      uVar15 = (ulong)uVar3 * 0xc;
      paVar8 = (aiVector3D *)operator_new__(uVar15);
      if ((ulong)uVar3 != 0) {
        memset(paVar8,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest_00->mTangents = paVar8;
      memcpy(paVar8,paVar4,uVar15);
    }
    paVar4 = __dest_00->mBitangents;
    if (paVar4 != (aiVector3D *)0x0) {
      uVar3 = __dest_00->mNumVertices;
      uVar15 = (ulong)uVar3 * 0xc;
      paVar8 = (aiVector3D *)operator_new__(uVar15);
      if ((ulong)uVar3 != 0) {
        memset(paVar8,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest_00->mBitangents = paVar8;
      memcpy(paVar8,paVar4,uVar15);
    }
    pppaVar1 = &__dest_00->mBones;
    pppaVar2 = &__dest_00->mAnimMeshes;
    lVar13 = 0;
    do {
      if ((__dest_00->mTextureCoords[lVar13] == (aiVector3D *)0x0) || (__dest_00->mNumVertices == 0)
         ) break;
      paVar4 = __dest_00->mTextureCoords[lVar13];
      if (paVar4 != (aiVector3D *)0x0) {
        uVar3 = __dest_00->mNumVertices;
        uVar15 = (ulong)uVar3 * 0xc;
        paVar8 = (aiVector3D *)operator_new__(uVar15);
        if ((ulong)uVar3 != 0) {
          memset(paVar8,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
        }
        __dest_00->mTextureCoords[lVar13] = paVar8;
        memcpy(paVar8,paVar4,uVar15);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    lVar13 = 0;
    do {
      if ((__dest_00->mColors[lVar13] == (aiColor4D *)0x0) || (__dest_00->mNumVertices == 0)) break;
      __src = __dest_00->mColors[lVar13];
      if (__src != (aiColor4D *)0x0) {
        uVar3 = __dest_00->mNumVertices;
        uVar15 = (ulong)uVar3 << 4;
        __s = (aiColor4D *)operator_new__(uVar15);
        if ((ulong)uVar3 != 0) {
          memset(__s,0,uVar15);
        }
        __dest_00->mColors[lVar13] = __s;
        memcpy(__s,__src,uVar15);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    if ((ulong)__dest_00->mNumBones == 0) {
      *pppaVar1 = (aiBone **)0x0;
    }
    else {
      ppaVar5 = __dest_00->mBones;
      uVar14 = (ulong)__dest_00->mNumBones << 3;
      ppaVar9 = (aiBone **)operator_new__(uVar14);
      *pppaVar1 = ppaVar9;
      uVar15 = 0;
      do {
        Copy((aiBone **)((long)*pppaVar1 + uVar15),*(aiBone **)((long)ppaVar5 + uVar15));
        uVar15 = uVar15 + 8;
      } while (uVar14 != uVar15);
    }
    paVar6 = __dest_00->mFaces;
    if (paVar6 != (aiFace *)0x0) {
      uVar15 = (ulong)__dest_00->mNumFaces;
      puVar10 = (ulong *)operator_new__(uVar15 * 0x10 + 8);
      __dest = (aiFace *)(puVar10 + 1);
      *puVar10 = uVar15;
      if (uVar15 != 0) {
        paVar12 = __dest;
        do {
          paVar12->mNumIndices = 0;
          paVar12->mIndices = (uint *)0x0;
          paVar12 = paVar12 + 1;
        } while (paVar12 != __dest + uVar15);
      }
      __dest_00->mFaces = __dest;
      memcpy(__dest,paVar6,uVar15 * 0x10);
    }
    if (__dest_00->mNumFaces != 0) {
      lVar13 = 8;
      uVar15 = 0;
      do {
        paVar6 = __dest_00->mFaces;
        __src_00 = *(void **)((long)&paVar6->mNumIndices + lVar13);
        if (__src_00 != (void *)0x0) {
          uVar14 = (ulong)*(uint *)((long)paVar6 + lVar13 + -8) << 2;
          __dest_01 = operator_new__(uVar14);
          *(void **)((long)&paVar6->mNumIndices + lVar13) = __dest_01;
          memcpy(__dest_01,__src_00,uVar14);
        }
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar15 < __dest_00->mNumFaces);
    }
    if ((ulong)__dest_00->mNumAnimMeshes == 0) {
      *pppaVar2 = (aiAnimMesh **)0x0;
    }
    else {
      ppaVar7 = __dest_00->mAnimMeshes;
      uVar15 = (ulong)__dest_00->mNumAnimMeshes << 3;
      ppaVar11 = (aiAnimMesh **)operator_new__(uVar15);
      *pppaVar2 = ppaVar11;
      uVar14 = 0;
      do {
        Copy((aiAnimMesh **)((long)*pppaVar2 + uVar14),*(aiAnimMesh **)((long)ppaVar7 + uVar14));
        uVar14 = uVar14 + 8;
      } while (uVar15 != uVar14);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy( aiMesh** _dest, const aiMesh* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMesh* dest = *_dest = new aiMesh();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMesh));

    // and reallocate all arrays
    GetArrayCopy( dest->mVertices,   dest->mNumVertices );
    GetArrayCopy( dest->mNormals ,   dest->mNumVertices );
    GetArrayCopy( dest->mTangents,   dest->mNumVertices );
    GetArrayCopy( dest->mBitangents, dest->mNumVertices );

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy( dest->mTextureCoords[n++],   dest->mNumVertices );

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy( dest->mColors[n++],   dest->mNumVertices );

    // make a deep copy of all bones
    CopyPtrArray(dest->mBones,dest->mBones,dest->mNumBones);

    // make a deep copy of all faces
    GetArrayCopy(dest->mFaces,dest->mNumFaces);
    for (unsigned int i = 0; i < dest->mNumFaces;++i) {
        aiFace& f = dest->mFaces[i];
        GetArrayCopy(f.mIndices,f.mNumIndices);
    }

    // make a deep copy of all blend shapes
    CopyPtrArray(dest->mAnimMeshes, dest->mAnimMeshes, dest->mNumAnimMeshes);
}